

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O0

int log2i(sexp_uint_t v)

{
  int i;
  sexp_uint_t v_local;
  
  i = 0;
  while (((uint)i < 0x40 && ((ulong)(1L << ((char)i + 1U & 0x3f)) <= v))) {
    i = i + 1;
  }
  return i;
}

Assistant:

static int log2i(sexp_uint_t v) {
  int i;
  for (i = 0; i < sizeof(v)*8; i++)
    if (((sexp_uint_t)1<<(i+1)) > v)
      break;
  return i;
}